

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

bool __thiscall QCborStreamReaderPrivate::ensureStringIteration(QCborStreamReaderPrivate *this)

{
  byte bVar1;
  
  bVar1 = (this->currentElement).flags;
  if (((bVar1 & 8) == 0) && ((this->currentElement).flags = bVar1 | 0xc, (bVar1 & 0x10) != 0)) {
    advance_bytes(&this->currentElement,1);
  }
  return true;
}

Assistant:

bool QCborStreamReaderPrivate::ensureStringIteration()
{
    if (currentElement.flags & CborIteratorFlag_IteratingStringChunks)
        return true;

    CborError err = cbor_value_begin_string_iteration(&currentElement);
    if (!err)
        return true;
    handleError(err);
    return false;
}